

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  ChatClient client;
  allocator<char> local_10a;
  allocator<char> local_109;
  string local_108;
  string local_e8;
  undefined1 local_c8 [160];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_28;
  
  if (argc < 3) {
    ChatServer::ChatServer((ChatServer *)local_c8);
    Dashel::Hub::run();
    local_c8._0_8_ = &PTR__ChatServer_00106d40;
    std::
    _Rb_tree<Dashel::Stream_*,_std::pair<Dashel::Stream_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<Dashel::Stream_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<Dashel::Stream_*>,_std::allocator<std::pair<Dashel::Stream_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<Dashel::Stream_*,_std::pair<Dashel::Stream_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<Dashel::Stream_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<Dashel::Stream_*>,_std::allocator<std::pair<Dashel::Stream_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)(local_c8 + 0x88));
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,argv[1],&local_109);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,argv[2],&local_10a);
    ChatClient::ChatClient((ChatClient *)local_c8,&local_e8,&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    Dashel::Hub::run();
    local_c8._0_8_ = &PTR__ChatClient_00106cf0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._144_8_ != &local_28) {
      operator_delete((void *)local_c8._144_8_,local_28._M_allocated_capacity + 1);
    }
  }
  Dashel::Hub::~Hub((Hub *)local_c8);
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
	try
	{
		if (argc > 2)
		{
			ChatClient client(argv[1], argv[2]);
			client.run();
		}
		else
		{
			ChatServer server;
			server.run();
		}
	}
	catch (const DashelException& e)
	{
		std::cerr << e.what() << std::endl;
	}

	return 0;
}